

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_file_reader.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  ostream *poVar2;
  Reader *__p;
  element_type *peVar3;
  char *pcVar4;
  undefined1 local_78 [8];
  vector<char,_std::allocator<char>_> line;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  shared_ptr<diffusion::Reader> file_reader;
  char **argv_local;
  int argc_local;
  
  file_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)(file_reader.
                                             super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_vptr__Sp_counted_base);
    poVar2 = std::operator<<(poVar2," diffusion_file");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    pcVar4 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar4,&local_49);
    __p = diffusion::create_file_reader(&local_48);
    std::shared_ptr<diffusion::Reader>::shared_ptr<diffusion::Reader,void>
              ((shared_ptr<diffusion::Reader> *)local_28,__p);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    while( true ) {
      peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      uVar1 = (**peVar3->_vptr_Reader)();
      if ((uVar1 & 1) == 0) break;
      peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      (*peVar3->_vptr_Reader[1])(local_78);
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_78);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)local_78);
      std::ostream::write((char *)&std::cout,(long)pcVar4);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_78);
    }
    std::shared_ptr<diffusion::Reader>::~shared_ptr((shared_ptr<diffusion::Reader> *)local_28);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 2) {
        std::cerr << "Usage: " << argv[0] << " diffusion_file" << std::endl;
        return 0;
    }
    auto file_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_file_reader(argv[1]));
    while (file_reader->can_read()) {
        auto line = file_reader->read();
        std::cout.write(line.data(), line.size());
        std::cout << std::endl;
    }
    return 0;
}